

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  allocator local_d9;
  string local_d8 [39];
  allocator local_b1;
  string local_b0 [39];
  allocator local_89;
  string local_88 [39];
  allocator local_61;
  string local_60 [55];
  allocator local_29;
  string local_28 [32];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_28,"build/bin/1s.txt",&local_29);
  ReadLevelFile((string *)local_28,(string *)levelOne_abi_cxx11_);
  std::__cxx11::string::~string(local_28);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,"build/bin/2s.txt",&local_61);
  ReadLevelFile((string *)local_60,(string *)levelTwo_abi_cxx11_);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"build/bin/3s.txt",&local_89);
  ReadLevelFile((string *)local_88,(string *)levelThree_abi_cxx11_);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b0,"build/bin/4s.txt",&local_b1);
  ReadLevelFile((string *)local_b0,(string *)levelFour_abi_cxx11_);
  std::__cxx11::string::~string(local_b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d8,"build/bin/5s.txt",&local_d9);
  ReadLevelFile((string *)local_d8,(string *)levelFive_abi_cxx11_);
  std::__cxx11::string::~string(local_d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_d9);
  GameMenuOne();
  GameMenuTwo();
  PrintGameMenu();
  StartGame();
  system("PAUSE");
  return 0;
}

Assistant:

int main()
{

    ReadLevelFile("build/bin/1s.txt", levelOne);
    ReadLevelFile("build/bin/2s.txt", levelTwo);
    ReadLevelFile("build/bin/3s.txt", levelThree);
    ReadLevelFile("build/bin/4s.txt", levelFour);
    ReadLevelFile("build/bin/5s.txt", levelFive);
    GameMenuOne();
    GameMenuTwo();
    PrintGameMenu();
    StartGame();
    system("PAUSE");
}